

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::unrecognizedExpressionToken(SelectionCompiler *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  any tmp;
  string tokenStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  valuePeek((SelectionCompiler *)local_50);
  local_40._8_8_ = 0;
  local_30 = 0;
  local_40._M_allocated_capacity = (size_type)(local_50 + 0x20);
  plVar3 = (long *)std::__any_caster<std::__cxx11::string>((any *)local_50);
  if (plVar3 != (long *)0x0) {
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,*plVar3,plVar3[1] + *plVar3);
    std::__cxx11::string::operator=((string *)(local_50 + 0x10),(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_70,"unrecognized expression token:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_50 + 0x10));
    bVar2 = compileError(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_40._M_allocated_capacity != local_50 + 0x20) {
      operator_delete((void *)local_40._M_allocated_capacity,CONCAT71(uStack_2f,local_30) + 1);
    }
    if ((code *)local_50._0_8_ != (code *)0x0) {
      (*(code *)local_50._0_8_)(3,local_50,0);
    }
    return bVar2;
  }
  std::__throw_bad_any_cast();
}

Assistant:

bool unrecognizedExpressionToken() {
      std::any tmp = valuePeek();
      std::string tokenStr;

      try {
        tokenStr = std::any_cast<std::string>(tmp);
      } catch (const std::bad_any_cast&) {
        return compileError("any_cast error");
      }

      return compileError("unrecognized expression token:" + tokenStr);
    }